

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ValueExpressionBase::fromSymbol
          (ASTContext *context,Symbol *symbol,HierarchicalReference *hierRef,SourceRange sourceRange
          ,bool constraintAllowed,bool isDottedAccess)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  SourceRange sourceRange_08;
  SourceRange sourceRange_09;
  SourceRange sourceRange_10;
  SourceRange sourceRange_11;
  SourceRange sourceRange_12;
  SourceRange sourceRange_13;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  optional<slang::SourceRange> sourceRange_14;
  optional<slang::SourceRange> sourceRange_15;
  SourceRange referencingRange;
  bool bVar1;
  bool bVar2;
  VariableSymbol *pVVar3;
  FormalArgumentSymbol *pFVar4;
  ConstraintBlockSymbol *pCVar5;
  NetSymbol *pNVar6;
  ClockVarSymbol *pCVar7;
  SpecparamSymbol *pSVar8;
  Type *args_2;
  Expression *pEVar9;
  undefined8 in_RCX;
  long *in_RDX;
  Compilation *in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  Expression *result;
  Type *type;
  bool isLValue;
  SyntaxNode *syntax;
  ValueSymbol *value;
  Diagnostic *diag;
  string_view name;
  NetType *netType;
  VariableSymbol *var;
  bitmask<slang::ast::ASTFlags> flags;
  Compilation *comp;
  bool isUnbounded;
  Expression *in_stack_fffffffffffffbd8;
  Compilation *in_stack_fffffffffffffbe0;
  SourceLocation in_stack_fffffffffffffbe8;
  Symbol *in_stack_fffffffffffffbf0;
  DiagCode noteCode;
  Compilation *pCVar10;
  undefined5 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbfd;
  undefined1 in_stack_fffffffffffffbfe;
  byte bVar11;
  undefined1 in_stack_fffffffffffffbff;
  undefined1 uVar12;
  SourceLocation in_stack_fffffffffffffc00;
  SourceLocation in_stack_fffffffffffffc08;
  BumpAllocator *in_stack_fffffffffffffc10;
  DiagCode code;
  undefined2 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1a;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffc1c;
  undefined1 in_stack_fffffffffffffc1d;
  byte in_stack_fffffffffffffc1e;
  byte in_stack_fffffffffffffc1f;
  Compilation *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  bitmask<slang::ast::ConstraintBlockFlags> *in_stack_fffffffffffffc30;
  bool local_3a9;
  undefined8 in_stack_fffffffffffffc58;
  undefined6 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc66;
  undefined1 in_stack_fffffffffffffc67;
  Compilation *in_stack_fffffffffffffc68;
  Type *local_388;
  not_null<const_slang::ast::Type_*> local_380;
  HierarchicalValueExpression *local_378;
  bitmask<slang::ast::ASTFlags> local_370;
  Type *local_368;
  bitmask<slang::ast::ASTFlags> local_360;
  byte local_351;
  bitmask<slang::ast::ASTFlags> local_350;
  SyntaxNode *local_348;
  ASTContext *in_stack_fffffffffffffcc0;
  Symbol *in_stack_fffffffffffffcc8;
  bitmask<slang::ast::ASTFlags> local_328;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  string_view local_2d8;
  bitmask<slang::ast::ASTFlags> local_2c8;
  bitmask<slang::ast::ASTFlags> local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a4;
  size_t local_2a0;
  pointer local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined4 local_27c;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd88;
  SourceLocation in_stack_fffffffffffffd90;
  SourceLocation in_stack_fffffffffffffd98;
  bitmask<slang::ast::ASTFlags> local_248;
  size_t local_240;
  pointer local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined4 local_21c;
  bitmask<slang::ast::ASTFlags> local_218;
  NetType *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f4;
  bitmask<slang::ast::ASTFlags> local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d4;
  bitmask<slang::ast::ASTFlags> local_1d0;
  bitmask<slang::ast::ASTFlags> local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  Expression *local_1b0;
  Compilation *local_1a8;
  SourceLocation local_1a0;
  bitmask<slang::ast::ConstraintBlockFlags> local_191;
  size_t local_190;
  pointer local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined4 local_16e;
  bitmask<slang::ast::VariableFlags> local_16a;
  bitmask<slang::ast::ASTFlags> local_168;
  size_t local_160;
  pointer local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined4 local_13e;
  bitmask<slang::ast::VariableFlags> local_13a;
  bitmask<slang::ast::ASTFlags> local_138;
  size_t local_130;
  pointer local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_10c;
  bitmask<slang::ast::ASTFlags> local_108;
  size_t local_100;
  pointer local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 local_dc;
  bitmask<slang::ast::ASTFlags> local_d8;
  size_t local_d0;
  pointer local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_ac;
  bitmask<slang::ast::ASTFlags> local_a8;
  bitmask<slang::ast::VariableFlags> local_9a;
  size_t local_98;
  pointer local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_74;
  bitmask<slang::ast::ASTFlags> local_70;
  Expression *local_68;
  Compilation *local_60;
  SourceLocation local_58;
  VariableSymbol *local_50;
  undefined8 local_48;
  Compilation *local_40;
  byte local_33;
  byte local_32;
  byte local_31;
  long *local_30;
  Compilation *local_28;
  size_t local_20;
  undefined8 local_18;
  undefined8 local_10;
  ArbitrarySymbolExpression *local_8;
  
  uVar13 = (undefined1)((ulong)in_stack_fffffffffffffc58 >> 0x38);
  local_31 = in_R9B & 1;
  local_32 = in_stack_00000008 & 1;
  local_33 = 0;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_R8;
  local_40 = ASTContext::getCompilation((ASTContext *)0xa1b336);
  local_48 = *(undefined8 *)(local_20 + 0x10);
  bVar1 = VariableSymbol::isKind
                    (*(SymbolKind *)
                      &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                          *)&local_28->super_BumpAllocator)->
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  if ((bVar1) &&
     (pVVar3 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xa1b377),
     pVVar3->lifetime == Automatic)) {
    local_50 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xa1b391);
    if (*(SymbolKind *)
         &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             *)&local_28->super_BumpAllocator)->
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == ClassProperty) {
      in_stack_fffffffffffffc68 = local_28;
      std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
                ((optional<slang::SourceRange> *)in_stack_fffffffffffffbe0,
                 (SourceRange *)in_stack_fffffffffffffbd8);
      sourceRange_14.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           (SourceLocation)in_stack_fffffffffffffce8;
      sourceRange_14.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)in_stack_fffffffffffffce0;
      sourceRange_14.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_4_ = in_stack_fffffffffffffcf0;
      sourceRange_14.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._20_4_ = in_stack_fffffffffffffcf4;
      bVar1 = Lookup::ensureAccessible
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,sourceRange_14);
      in_stack_fffffffffffffbd8 = local_68;
      in_stack_fffffffffffffbe0 = local_60;
      in_stack_fffffffffffffbe8 = local_58;
      if (!bVar1) {
        pEVar9 = Expression::badExpr(local_60,local_68);
        return pEVar9;
      }
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_70,EventExpression);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc67 = false;
      if (bVar1) {
        in_stack_fffffffffffffc67 =
             *(SymbolKind *)
              &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                  *)&local_28->super_BumpAllocator)->
               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start == LocalAssertionVar;
      }
      if ((bool)in_stack_fffffffffffffc67 != false) {
        local_74 = 0x6b0007;
        local_88 = local_18;
        local_80 = local_10;
        sourceRange_00.endLoc = in_stack_fffffffffffffc08;
        sourceRange_00.startLoc = in_stack_fffffffffffffc00;
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffbff,
                                     CONCAT16(in_stack_fffffffffffffbfe,
                                              CONCAT15(in_stack_fffffffffffffbfd,
                                                       in_stack_fffffffffffffbf8))),
                            SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_00);
        local_98 = ((string_view *)
                   &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       *)&local_28->super_BumpAllocator)->
                    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
        local_90 = *(pointer *)&local_28->options;
        arg._M_str = (char *)in_stack_fffffffffffffc30;
        arg._M_len = in_stack_fffffffffffffc28;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg);
        pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        return pEVar9;
      }
      uVar13 = (undefined1)((ulong)&local_50->flags >> 0x38);
      bitmask<slang::ast::VariableFlags>::bitmask(&local_9a,RefStatic);
      bVar1 = bitmask<slang::ast::VariableFlags>::has
                        ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbe0,
                         (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffc66 = false;
      if (!bVar1) {
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        in_stack_fffffffffffffc66 = false;
        if (bVar1) {
          in_stack_fffffffffffffc66 = (local_50->super_ValueSymbol).super_Symbol.kind != PatternVar;
        }
      }
      if ((bool)in_stack_fffffffffffffc66 != false) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_a8,NonProcedural);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        if (bVar1) {
          local_ac = 0x1a0007;
          local_c0 = local_18;
          local_b8 = local_10;
          sourceRange_01.endLoc = in_stack_fffffffffffffc08;
          sourceRange_01.startLoc = in_stack_fffffffffffffc00;
          ASTContext::addDiag((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffbff,
                                       CONCAT16(in_stack_fffffffffffffbfe,
                                                CONCAT15(in_stack_fffffffffffffbfd,
                                                         in_stack_fffffffffffffbf8))),
                              SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_01);
          local_d0 = ((string_view *)
                     &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                         *)&local_28->super_BumpAllocator)->
                      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
          local_c8 = *(pointer *)&local_28->options;
          arg_00._M_str = (char *)in_stack_fffffffffffffc30;
          arg_00._M_len = in_stack_fffffffffffffc28;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_00);
          pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          return pEVar9;
        }
        bitmask<slang::ast::ASTFlags>::bitmask(&local_d8,StaticInitializer);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        if (bVar1) {
          local_dc = 0x1b0007;
          local_f0 = local_18;
          local_e8 = local_10;
          sourceRange_02.endLoc = in_stack_fffffffffffffc08;
          sourceRange_02.startLoc = in_stack_fffffffffffffc00;
          ASTContext::addDiag((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffbff,
                                       CONCAT16(in_stack_fffffffffffffbfe,
                                                CONCAT15(in_stack_fffffffffffffbfd,
                                                         in_stack_fffffffffffffbf8))),
                              SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_02);
          local_100 = ((string_view *)
                      &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                          *)&local_28->super_BumpAllocator)->
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
          local_f8 = *(pointer *)&local_28->options;
          arg_01._M_str = (char *)in_stack_fffffffffffffc30;
          arg_01._M_len = in_stack_fffffffffffffc28;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_01);
          pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          return pEVar9;
        }
        bitmask<slang::ast::ASTFlags>::bitmask(&local_108,NonBlockingTimingControl);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        if (bVar1) {
          local_10c = 0x190007;
          local_120 = local_18;
          local_118 = local_10;
          sourceRange_03.endLoc = in_stack_fffffffffffffc08;
          sourceRange_03.startLoc = in_stack_fffffffffffffc00;
          ASTContext::addDiag((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffbff,
                                       CONCAT16(in_stack_fffffffffffffbfe,
                                                CONCAT15(in_stack_fffffffffffffbfd,
                                                         in_stack_fffffffffffffbf8))),
                              SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_03);
          local_130 = ((string_view *)
                      &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                          *)&local_28->super_BumpAllocator)->
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
          local_128 = *(pointer *)&local_28->options;
          arg_02._M_str = (char *)in_stack_fffffffffffffc30;
          arg_02._M_len = in_stack_fffffffffffffc28;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_02);
          pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          return pEVar9;
        }
      }
      bitmask<slang::ast::ASTFlags>::bitmask(&local_138,AllowCoverageSampleFormal);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      local_3a9 = false;
      if (!bVar1) {
        bitmask<slang::ast::VariableFlags>::bitmask(&local_13a,CoverageSampleFormal);
        local_3a9 = bitmask<slang::ast::VariableFlags>::has
                              ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbe0,
                               (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbd8);
      }
      if (local_3a9 != false) {
        local_13e = 0x470007;
        local_150 = local_18;
        local_148 = local_10;
        sourceRange_04.endLoc = in_stack_fffffffffffffc08;
        sourceRange_04.startLoc = in_stack_fffffffffffffc00;
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffbff,
                                     CONCAT16(in_stack_fffffffffffffbfe,
                                              CONCAT15(in_stack_fffffffffffffbfd,
                                                       in_stack_fffffffffffffbf8))),
                            SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_04);
        local_160 = ((string_view *)
                    &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        *)&local_28->super_BumpAllocator)->
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
        local_158 = *(pointer *)&local_28->options;
        arg_03._M_str = (char *)in_stack_fffffffffffffc30;
        arg_03._M_len = in_stack_fffffffffffffc28;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_03);
        pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        return pEVar9;
      }
      bitmask<slang::ast::ASTFlags>::bitmask(&local_168,ForkJoinAnyNone);
      bVar2 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      bVar1 = false;
      if (bVar2) {
        bitmask<slang::ast::VariableFlags>::bitmask(&local_16a,RefStatic);
        bVar2 = bitmask<slang::ast::VariableFlags>::has
                          ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbe0,
                           (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffbd8);
        bVar1 = false;
        if ((!bVar2) &&
           (bVar1 = false,
           *(SymbolKind *)
            &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                *)&local_28->super_BumpAllocator)->
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == FormalArgument)) {
          pFVar4 = Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0xa1ba20);
          bVar1 = pFVar4->direction == Ref;
        }
      }
      if (bVar1) {
        local_16e = 0x910007;
        local_180 = local_18;
        local_178 = local_10;
        sourceRange_05.endLoc = in_stack_fffffffffffffc08;
        sourceRange_05.startLoc = in_stack_fffffffffffffc00;
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffbff,
                                     CONCAT16(in_stack_fffffffffffffbfe,
                                              CONCAT15(in_stack_fffffffffffffbfd,
                                                       in_stack_fffffffffffffbf8))),
                            SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_05);
        local_190 = ((string_view *)
                    &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        *)&local_28->super_BumpAllocator)->
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
        local_188 = *(pointer *)&local_28->options;
        arg_04._M_str = (char *)in_stack_fffffffffffffc30;
        arg_04._M_len = in_stack_fffffffffffffc28;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_04);
        pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        return pEVar9;
      }
    }
  }
  else if (*(SymbolKind *)
            &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                *)&local_28->super_BumpAllocator)->
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == ConstraintBlock) {
    pCVar5 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0xa1bb0d);
    in_stack_fffffffffffffc30 = &pCVar5->flags;
    bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_191,Static);
    bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                      ((bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffbe0,
                       (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffbd8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffc20 = local_28;
      std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
                ((optional<slang::SourceRange> *)in_stack_fffffffffffffbe0,
                 (SourceRange *)in_stack_fffffffffffffbd8);
      sourceRange_15.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           (SourceLocation)in_stack_fffffffffffffce8;
      sourceRange_15.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)in_stack_fffffffffffffce0;
      sourceRange_15.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_4_ = in_stack_fffffffffffffcf0;
      sourceRange_15.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._20_4_ = in_stack_fffffffffffffcf4;
      Lookup::ensureAccessible(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,sourceRange_15);
      in_stack_fffffffffffffbd8 = local_1b0;
      in_stack_fffffffffffffbe0 = local_1a8;
      in_stack_fffffffffffffbe8 = local_1a0;
      in_stack_fffffffffffffc28 = local_20;
    }
  }
  else if (*(SymbolKind *)
            &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                *)&local_28->super_BumpAllocator)->
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == Parameter) {
    Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0xa1bbc6);
    local_1c0 = local_18;
    local_1b8 = local_10;
    referencingRange.endLoc = in_stack_fffffffffffffd98;
    referencingRange.startLoc = in_stack_fffffffffffffd90;
    ParameterSymbol::getValue((ParameterSymbol *)in_stack_fffffffffffffd88.m_bits,referencingRange);
    local_33 = slang::ConstantValue::isUnbounded((ConstantValue *)0xa1bc06);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1c8,AllowUnboundedLiteral);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_1d0,AllowUnboundedLiteralArithmetic);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc1f = 0;
      if (bVar1) goto LAB_00a1bc72;
    }
    else {
LAB_00a1bc72:
      in_stack_fffffffffffffc1f = 0;
      if ((local_33 & 1) != 0) {
        bVar1 = ASTContext::inUnevaluatedBranch((ASTContext *)in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffc1f = bVar1 ^ 0xff;
      }
    }
    if ((in_stack_fffffffffffffc1f & 1) != 0) {
      local_1d4 = 0xa10007;
      local_1e8 = local_18;
      local_1e0 = local_10;
      sourceRange_06.endLoc = in_stack_fffffffffffffc08;
      sourceRange_06.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_06);
      pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      return pEVar9;
    }
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1f0,SpecifyBlock);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      local_1f4 = 0xd50007;
      local_208 = local_18;
      local_200 = local_10;
      sourceRange_07.endLoc = in_stack_fffffffffffffc08;
      sourceRange_07.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_07);
    }
  }
  else if (*(SymbolKind *)
            &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                *)&local_28->super_BumpAllocator)->
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == Net) {
    pNVar6 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xa1bdb4);
    local_210 = pNVar6->netType;
    in_stack_fffffffffffffc1e = 0;
    if (local_210->netKind == Interconnect) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_218,AllowInterconnect);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc1e = bVar1 ^ 0xff;
    }
    if ((in_stack_fffffffffffffc1e & 1) != 0) {
      local_21c = 0x5e0007;
      local_230 = local_18;
      local_228 = local_10;
      sourceRange_08.endLoc = in_stack_fffffffffffffc08;
      sourceRange_08.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_08);
      local_240 = ((string_view *)
                  &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                      *)&local_28->super_BumpAllocator)->
                   super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
      local_238 = *(pointer *)&local_28->options;
      arg_05._M_str = (char *)in_stack_fffffffffffffc30;
      arg_05._M_len = in_stack_fffffffffffffc28;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_05);
      pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      return pEVar9;
    }
    bVar1 = false;
    if (local_210->netKind == UserDefined) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_248,DisallowUDNT);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    }
    if (bVar1 != false) {
      sourceRange_09.endLoc = in_stack_fffffffffffffc08;
      sourceRange_09.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_09);
      arg_06._M_str = (char *)in_stack_fffffffffffffc30;
      arg_06._M_len = in_stack_fffffffffffffc28;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_06);
      pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      return pEVar9;
    }
    in_stack_fffffffffffffc1d = 0;
  }
  else {
    in_stack_fffffffffffffc1c = false;
    if (*(SymbolKind *)
         &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             *)&local_28->super_BumpAllocator)->
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == ClockVar) {
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffd88,LValue);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc1c = false;
      if (!bVar1) {
        pCVar7 = Symbol::as<slang::ast::ClockVarSymbol>((Symbol *)0xa1c00f);
        in_stack_fffffffffffffc1c = pCVar7->direction == Out;
      }
    }
    if ((bool)in_stack_fffffffffffffc1c != false) {
      local_27c = 0x400007;
      local_290 = local_18;
      local_288 = local_10;
      sourceRange_10.endLoc = in_stack_fffffffffffffc08;
      sourceRange_10.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_10);
      local_2a0 = ((string_view *)
                  &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                      *)&local_28->super_BumpAllocator)->
                   super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)->_M_len;
      local_298 = *(pointer *)&local_28->options;
      arg_07._M_str = (char *)in_stack_fffffffffffffc30;
      arg_07._M_len = in_stack_fffffffffffffc28;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_07);
      pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      return pEVar9;
    }
    if ((*(SymbolKind *)
          &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              *)&local_28->super_BumpAllocator)->
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start == Specparam) &&
       (pSVar8 = Symbol::as<slang::ast::SpecparamSymbol>((Symbol *)0xa1c0ef),
       (pSVar8->isPathPulse & 1U) != 0)) {
      local_2a4 = 0x840007;
      local_2b8 = local_18;
      local_2b0 = local_10;
      sourceRange_11.endLoc = in_stack_fffffffffffffc08;
      sourceRange_11.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),
                          SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_11);
      pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      return pEVar9;
    }
  }
  bVar1 = Symbol::isValue((Symbol *)0xa1c17e);
  if (bVar1) {
    Symbol::as<slang::ast::ValueSymbol>((Symbol *)0xa1c3cc);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_328,AssertionExpr);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    uVar12 = false;
    if (bVar1) {
      ValueSymbol::getType((ValueSymbol *)0xa1c417);
      uVar12 = Type::isCHandle((Type *)0xa1c41f);
    }
    if ((bool)uVar12 == false) {
      local_348 = Symbol::getSyntax((Symbol *)local_28);
      bVar11 = 0;
      if (local_348 != (SyntaxNode *)0x0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_350,NoReference);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        bVar11 = bVar1 ^ 0xff;
      }
      if ((bVar11 & 1) != 0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_360,LValue);
        local_351 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                               (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        if ((local_32 & 1) != 0) {
          local_368 = ValueSymbol::getType((ValueSymbol *)0xa1c548);
          bVar1 = Type::isClass((Type *)0xa1c55d);
          if ((bVar1) || (bVar1 = Type::isCovergroup((Type *)0xa1c56e), bVar1)) {
            local_351 = 0;
          }
        }
        Compilation::noteReference
                  (in_stack_fffffffffffffc68,
                   (SyntaxNode *)
                   CONCAT17(in_stack_fffffffffffffc67,
                            CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
                   (bool)uVar13);
        in_stack_fffffffffffffbfd = false;
        if ((local_351 & 1) != 0) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_370,LAndRValue);
          in_stack_fffffffffffffbfd =
               bitmask<slang::ast::ASTFlags>::has
                         ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                          (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
        }
        if ((bool)in_stack_fffffffffffffbfd != false) {
          Compilation::noteReference
                    (in_stack_fffffffffffffc68,
                     (SyntaxNode *)
                     CONCAT17(in_stack_fffffffffffffc67,
                              CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
                     (bool)uVar13);
        }
      }
      if ((local_30 == (long *)0x0) || (*local_30 == 0)) {
        local_378 = (HierarchicalValueExpression *)
                    BumpAllocator::
                    emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                              ((BumpAllocator *)in_stack_fffffffffffffc00,
                               (ValueSymbol *)
                               CONCAT17(uVar12,CONCAT16(bVar11,CONCAT15(in_stack_fffffffffffffbfd,
                                                                        in_stack_fffffffffffffbf8)))
                               ,(SourceRange *)in_stack_fffffffffffffbf0);
      }
      else {
        pCVar10 = local_40;
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0xa1c635);
        local_378 = BumpAllocator::
                    emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
                              (in_stack_fffffffffffffc10,(Scope *)in_stack_fffffffffffffc08,
                               (ValueSymbol *)in_stack_fffffffffffffc00,
                               (HierarchicalReference *)
                               CONCAT17(uVar12,CONCAT16(bVar11,CONCAT15(in_stack_fffffffffffffbfd,
                                                                        in_stack_fffffffffffffbf8)))
                               ,(SourceRange *)pCVar10);
      }
      if ((local_33 & 1) != 0) {
        local_388 = Compilation::getUnboundedType((Compilation *)0xa1c6a0);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                  (&local_380,&local_388);
        ((not_null<const_slang::ast::Type_*> *)
        ((long)&(local_378->super_ValueExpressionBase).super_Expression + 8))->ptr = local_380.ptr;
      }
      return (Expression *)local_378;
    }
    sourceRange_13.endLoc = in_stack_fffffffffffffc08;
    sourceRange_13.startLoc = in_stack_fffffffffffffc00;
    ASTContext::addDiag((ASTContext *)
                        CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffbfe,
                                                 CONCAT15(in_stack_fffffffffffffbfd,
                                                          in_stack_fffffffffffffbf8))),
                        SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0),sourceRange_13);
    pEVar9 = Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    return pEVar9;
  }
  if (*(SymbolKind *)
       &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_28->super_BumpAllocator)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == ClockingBlock) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_2c0,AllowClockingBlock);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    code = SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0);
    uVar13 = true;
    if (bVar1) goto LAB_00a1c22a;
  }
  code = SUB84((ulong)in_stack_fffffffffffffc10 >> 0x20,0);
  if (((*(SymbolKind *)
         &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             *)&local_28->super_BumpAllocator)->
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start != ConstraintBlock) ||
      (uVar13 = true, (local_31 & 1) == 0)) &&
     (in_stack_fffffffffffffc1a = false, uVar13 = in_stack_fffffffffffffc1a,
     *(SymbolKind *)
      &(((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          *)&local_28->super_BumpAllocator)->
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start == Coverpoint)) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_2c8,AllowCoverpoint);
    in_stack_fffffffffffffc1a =
         bitmask<slang::ast::ASTFlags>::has
                   ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf0,
                    (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbe8);
    uVar13 = in_stack_fffffffffffffc1a;
  }
LAB_00a1c22a:
  if ((bool)uVar13 == false) {
    local_2d8 = getNonValueName(in_stack_fffffffffffffbf0);
    noteCode = SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2d8);
    if (!bVar1) {
      sourceRange_12.endLoc = in_stack_fffffffffffffc08;
      sourceRange_12.startLoc = in_stack_fffffffffffffc00;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,
                                            CONCAT15(in_stack_fffffffffffffbfd,
                                                     in_stack_fffffffffffffbf8))),code,
                          sourceRange_12);
      arg_08._M_str = (char *)in_stack_fffffffffffffc30;
      arg_08._M_len = in_stack_fffffffffffffc28;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc20,arg_08);
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffbe0,noteCode,in_stack_fffffffffffffbe8
                         );
    }
    local_8 = (ArbitrarySymbolExpression *)
              Expression::badExpr(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  }
  else {
    pCVar10 = local_40;
    args_2 = (Type *)not_null<const_slang::ast::Scope_*>::operator*
                               ((not_null<const_slang::ast::Scope_*> *)0xa1c24e);
    Compilation::getVoidType(local_40);
    local_8 = BumpAllocator::
              emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference_const*&,slang::SourceRange&>
                        (&in_stack_fffffffffffffc20->super_BumpAllocator,
                         (Scope *)CONCAT17(in_stack_fffffffffffffc1f,
                                           CONCAT16(in_stack_fffffffffffffc1e,
                                                    CONCAT15(in_stack_fffffffffffffc1d,
                                                             CONCAT14(in_stack_fffffffffffffc1c,
                                                                      CONCAT13(uVar13,CONCAT12(
                                                  in_stack_fffffffffffffc1a,
                                                  in_stack_fffffffffffffc18)))))),(Symbol *)local_28
                         ,args_2,(HierarchicalReference **)pCVar10,
                         (SourceRange *)
                         CONCAT17(in_stack_fffffffffffffbff,
                                  CONCAT16(in_stack_fffffffffffffbfe,
                                           CONCAT15(in_stack_fffffffffffffbfd,
                                                    in_stack_fffffffffffffbf8))));
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& ValueExpressionBase::fromSymbol(const ASTContext& context, const Symbol& symbol,
                                            const HierarchicalReference* hierRef,
                                            SourceRange sourceRange, bool constraintAllowed,
                                            bool isDottedAccess) {
    // Automatic variables have additional restrictions.
    bool isUnbounded = false;
    auto& comp = context.getCompilation();
    auto flags = context.flags;
    if (VariableSymbol::isKind(symbol.kind) &&
        symbol.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {

        // If this is actually a class property, check that no static methods,
        // initializers, or nested classes are accessing it.
        auto& var = symbol.as<VariableSymbol>();
        if (symbol.kind == SymbolKind::ClassProperty) {
            if (!Lookup::ensureAccessible(symbol, context, sourceRange))
                return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::EventExpression) &&
                 symbol.kind == SymbolKind::LocalAssertionVar) {
            context.addDiag(diag::LocalVarEventExpr, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (!var.flags.has(VariableFlags::RefStatic) && flags.has(DisallowedAutoVarContexts) &&
                 var.kind != SymbolKind::PatternVar) {
            if (flags.has(ASTFlags::NonProcedural)) {
                context.addDiag(diag::AutoFromNonProcedural, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::StaticInitializer)) {
                context.addDiag(diag::AutoFromStaticInit, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::NonBlockingTimingControl)) {
                context.addDiag(diag::AutoFromNonBlockingTiming, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else {
                SLANG_UNREACHABLE;
            }
        }
        else if (!flags.has(ASTFlags::AllowCoverageSampleFormal) &&
                 var.flags.has(VariableFlags::CoverageSampleFormal)) {
            context.addDiag(diag::CoverageSampleFormal, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::ForkJoinAnyNone) && !var.flags.has(VariableFlags::RefStatic) &&
                 symbol.kind == SymbolKind::FormalArgument &&
                 symbol.as<FormalArgumentSymbol>().direction == ArgumentDirection::Ref) {
            // Can't refer to ref args in fork-join_any/none
            context.addDiag(diag::RefArgForkJoin, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ConstraintBlock) {
        if (!symbol.as<ConstraintBlockSymbol>().flags.has(ConstraintBlockFlags::Static))
            Lookup::ensureAccessible(symbol, context, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Parameter) {
        // A note on the flags check: parameters with an unbounded value are allowed
        // anywhere that an unbounded literal is allowed, *except* for queue expressions,
        // which is indicated here by the AllowUnboundedLiteralArithmetic flag.
        isUnbounded = symbol.as<ParameterSymbol>().getValue(sourceRange).isUnbounded();
        if ((!flags.has(ASTFlags::AllowUnboundedLiteral) ||
             flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) &&
            isUnbounded && !context.inUnevaluatedBranch()) {
            context.addDiag(diag::UnboundedNotAllowed, sourceRange);
            return badExpr(comp, nullptr);
        }

        if (flags.has(ASTFlags::SpecifyBlock))
            context.addDiag(diag::SpecifyBlockParam, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Net) {
        auto& netType = symbol.as<NetSymbol>().netType;
        if (netType.netKind == NetType::Interconnect && !flags.has(ASTFlags::AllowInterconnect)) {
            context.addDiag(diag::InterconnectReference, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }

        if (netType.netKind == NetType::UserDefined && flags.has(ASTFlags::DisallowUDNT)) {
            context.addDiag(diag::GateUDNTConn, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ClockVar && !flags.has(ASTFlags::LValue) &&
             symbol.as<ClockVarSymbol>().direction == ArgumentDirection::Out) {
        context.addDiag(diag::ClockVarOutputRead, sourceRange) << symbol.name;
        return badExpr(comp, nullptr);
    }
    else if (symbol.kind == SymbolKind::Specparam && symbol.as<SpecparamSymbol>().isPathPulse) {
        context.addDiag(diag::PathPulseInExpr, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (!symbol.isValue()) {
        if ((symbol.kind == SymbolKind::ClockingBlock && flags.has(ASTFlags::AllowClockingBlock)) ||
            (symbol.kind == SymbolKind::ConstraintBlock && constraintAllowed) ||
            (symbol.kind == SymbolKind::Coverpoint && flags.has(ASTFlags::AllowCoverpoint))) {
            // Special case for event expressions and constraint block built-in methods.
            return *comp.emplace<ArbitrarySymbolExpression>(*context.scope, symbol,
                                                            comp.getVoidType(), hierRef,
                                                            sourceRange);
        }

        // It's possible for the name to be empty here in cases
        // where we looked up something like a generic class type
        // and there was some error in resolving it to a real type,
        // in which case `symbol` will be the ErrorType with an empty name.
        auto name = getNonValueName(symbol);
        if (!name.empty()) {
            auto& diag = context.addDiag(diag::NotAValue, sourceRange) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        return badExpr(comp, nullptr);
    }

    // chandles can't be referenced in sequence expressions
    auto& value = symbol.as<ValueSymbol>();
    if (flags.has(ASTFlags::AssertionExpr) && value.getType().isCHandle()) {
        context.addDiag(diag::CHandleInAssertion, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (auto syntax = symbol.getSyntax(); syntax && !flags.has(ASTFlags::NoReference)) {
        bool isLValue = flags.has(ASTFlags::LValue);
        if (isDottedAccess) {
            auto& type = value.getType();
            if (type.isClass() || type.isCovergroup())
                isLValue = false;
        }

        comp.noteReference(*syntax, isLValue);

        if (isLValue && flags.has(ASTFlags::LAndRValue))
            comp.noteReference(*syntax, /* isLValue */ false);
    }

    Expression* result;
    if (hierRef && hierRef->target) {
        result = comp.emplace<HierarchicalValueExpression>(*context.scope, value, *hierRef,
                                                           sourceRange);
    }
    else {
        result = comp.emplace<NamedValueExpression>(value, sourceRange);
    }

    if (isUnbounded)
        result->type = &comp.getUnboundedType();
    return *result;
}